

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::ShaderResourceBindingGLImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::ShaderResourceBindingGLImpl>::operator=
          (RefCntAutoPtr<Diligent::ShaderResourceBindingGLImpl> *this,
          ShaderResourceBindingGLImpl *pObj)

{
  ShaderResourceBindingGLImpl *pObj_local;
  RefCntAutoPtr<Diligent::ShaderResourceBindingGLImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (ShaderResourceBindingGLImpl *)0x0) {
      RefCountedObject<Diligent::IShaderResourceBindingGL>::Release
                ((RefCountedObject<Diligent::IShaderResourceBindingGL> *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (ShaderResourceBindingGLImpl *)0x0) {
      RefCountedObject<Diligent::IShaderResourceBindingGL>::AddRef
                ((RefCountedObject<Diligent::IShaderResourceBindingGL> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }